

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

bool __thiscall CConnman::Start(CConnman *this,CScheduler *scheduler,Options *connOptions)

{
  ConstevalStringLiteral str;
  ConstevalStringLiteral str_00;
  ConstevalStringLiteral str_01;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __last;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  bool bVar1;
  undefined1 uVar2;
  byte bVar3;
  size_type sVar4;
  int *piVar5;
  Mutex *flag;
  long in_RDX;
  ConstevalFormatString<0U> in_RDI;
  long in_FS_OFFSET;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  seed_nodes;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock84;
  Proxy i2p_sam;
  undefined4 in_stack_fffffffffffffa58;
  uint in_stack_fffffffffffffa5c;
  char *in_stack_fffffffffffffa60;
  FastRandomContext *in_stack_fffffffffffffa68;
  Proxy *in_stack_fffffffffffffa70;
  Network in_stack_fffffffffffffa78;
  int in_stack_fffffffffffffa7c;
  CThreadInterrupt **in_stack_fffffffffffffa80;
  undefined7 in_stack_fffffffffffffa88;
  undefined1 in_stack_fffffffffffffa8f;
  Options *in_stack_fffffffffffffa90;
  CConnman *in_stack_fffffffffffffa98;
  allocator<char> *__a;
  thread *in_stack_fffffffffffffaa0;
  char *__s;
  undefined6 in_stack_fffffffffffffaa8;
  undefined1 in_stack_fffffffffffffaae;
  undefined1 in_stack_fffffffffffffaaf;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffab0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  Options *in_stack_fffffffffffffab8;
  CConnman *in_stack_fffffffffffffac0;
  undefined8 in_stack_fffffffffffffac8;
  int source_line;
  milliseconds in_stack_fffffffffffffad8;
  path *in_stack_fffffffffffffae0;
  undefined4 in_stack_fffffffffffffb10;
  undefined4 in_stack_fffffffffffffb14;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffb18;
  size_t in_stack_fffffffffffffb20;
  char *in_stack_fffffffffffffb28;
  bool local_481;
  Level in_stack_fffffffffffffc00;
  unsigned_long *in_stack_fffffffffffffc10;
  allocator<char> local_3a1 [9];
  code *local_398;
  code *local_380;
  allocator<char> local_349 [9];
  code *local_340;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_338;
  undefined1 local_320 [111];
  allocator<char> local_2b1 [289];
  path local_190 [9];
  long local_8;
  
  source_line = (int)((ulong)in_stack_fffffffffffffac8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockNotHeldInline
            ((char *)in_stack_fffffffffffffa68,in_stack_fffffffffffffa60,in_stack_fffffffffffffa5c,
             (Mutex *)0x21c17c);
  Init(in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
  if (((fListen & 1U) == 0) ||
     (bVar1 = InitBinds(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8), bVar1)) {
    Proxy::Proxy((Proxy *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
    bVar1 = GetProxy(in_stack_fffffffffffffa78,in_stack_fffffffffffffa70);
    if ((bVar1) && ((*(byte *)(in_RDX + 0x108) & 1) != 0)) {
      ArgsManager::GetDataDirNet((ArgsManager *)in_stack_fffffffffffffa60);
      fs::operator/((path *)in_stack_fffffffffffffa70,(char *)in_stack_fffffffffffffa68);
      local_320._88_8_ = in_RDI.fmt + 0x308;
      std::make_unique<i2p::sam::Session,fs::path,Proxy&,CThreadInterrupt*>
                ((path *)in_stack_fffffffffffffa90,
                 (Proxy *)CONCAT17(in_stack_fffffffffffffa8f,in_stack_fffffffffffffa88),
                 in_stack_fffffffffffffa80);
      std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>::operator=
                ((unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> *)
                 in_stack_fffffffffffffa68,
                 (unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> *)
                 in_stack_fffffffffffffa60);
      std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>::~unique_ptr
                ((unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> *)
                 in_stack_fffffffffffffa68);
      fs::path::~path((path *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
      fs::path::~path((path *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(in_stack_fffffffffffffab0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)CONCAT17(in_stack_fffffffffffffaaf,
                         CONCAT16(in_stack_fffffffffffffaae,in_stack_fffffffffffffaa8)));
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffa68);
    if (!bVar1) {
      in_stack_fffffffffffffad8.__r = (rep)(local_320 + 0x40);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffa60);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffa60);
      in_stack_fffffffffffffae0 = local_190;
      FastRandomContext::FastRandomContext
                (in_stack_fffffffffffffa68,SUB81((ulong)in_stack_fffffffffffffa60 >> 0x38,0));
      __last._M_current._4_4_ = in_stack_fffffffffffffb14;
      __last._M_current._0_4_ = in_stack_fffffffffffffb10;
      std::
      shuffle<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,FastRandomContext>
                (in_stack_fffffffffffffb18,__last,(FastRandomContext *)in_stack_fffffffffffffac0);
      FastRandomContext::~FastRandomContext
                ((FastRandomContext *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58))
      ;
    }
    if ((in_RDI.fmt[0x25c] & 1U) != 0) {
      ArgsManager::GetDataDirNet((ArgsManager *)in_stack_fffffffffffffa60);
      fs::operator/((path *)in_stack_fffffffffffffa70,(char *)in_stack_fffffffffffffa68);
      ReadAnchors(in_stack_fffffffffffffae0);
      std::vector<CAddress,_std::allocator<CAddress>_>::operator=
                ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffffa68,
                 (vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffffa60);
      std::vector<CAddress,_std::allocator<CAddress>_>::~vector
                ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffffa68);
      fs::path::~path((path *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
      fs::path::~path((path *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
      sVar4 = std::vector<CAddress,_std::allocator<CAddress>_>::size
                        ((vector<CAddress,_std::allocator<CAddress>_> *)
                         CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
      if (2 < sVar4) {
        std::vector<CAddress,_std::allocator<CAddress>_>::resize
                  ((vector<CAddress,_std::allocator<CAddress>_> *)
                   CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                   (size_type)in_stack_fffffffffffffa70);
      }
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                 (char *)in_stack_fffffffffffffa70);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                 (char *)in_stack_fffffffffffffa70);
      local_320._0_8_ =
           std::vector<CAddress,_std::allocator<CAddress>_>::size
                     ((vector<CAddress,_std::allocator<CAddress>_> *)
                      CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
      in_stack_fffffffffffffa68 = (FastRandomContext *)local_320;
      in_stack_fffffffffffffa60 = "%i block-relay-only anchors will be tried for connections.\n";
      in_stack_fffffffffffffa58 = 2;
      logging_function._M_str = in_stack_fffffffffffffb28;
      logging_function._M_len = in_stack_fffffffffffffb20;
      source_file._M_len._4_4_ = in_stack_fffffffffffffb14;
      source_file._M_len._0_4_ = in_stack_fffffffffffffb10;
      source_file._M_str = (char *)in_stack_fffffffffffffb18._M_current;
      LogPrintFormatInternal<unsigned_long>
                (logging_function,source_file,source_line,(LogFlags)in_stack_fffffffffffffac0,
                 in_stack_fffffffffffffc00,(ConstevalFormatString<1U>)in_RDI.fmt,
                 in_stack_fffffffffffffc10);
    }
    if (*(long *)(in_RDI.fmt + 0x260) != 0) {
      in_stack_fffffffffffffb28 = anon_var_dwarf_100b40;
      str_00.lit._6_1_ = in_stack_fffffffffffffaae;
      str_00.lit._0_6_ = in_stack_fffffffffffffaa8;
      str_00.lit._7_1_ = in_stack_fffffffffffffaaf;
      ::_(str_00);
      CClientUIInterface::InitMessage
                ((CClientUIInterface *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58)
                 ,(string *)0x21c79c);
      bilingual_str::~bilingual_str
                ((bilingual_str *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
    }
    in_RDI.fmt[0xa9] = '\x01';
    bVar1 = std::operator==((unique_ptr<CSemaphore,_std::default_delete<CSemaphore>_> *)
                            in_stack_fffffffffffffa68,in_stack_fffffffffffffa60);
    if (bVar1) {
      piVar5 = std::min<int>((int *)in_stack_fffffffffffffa60,
                             (int *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
      source_line = (int)((ulong)piVar5 >> 0x20);
      std::make_unique<CSemaphore,int_const&>((int *)in_stack_fffffffffffffa70);
      std::unique_ptr<CSemaphore,_std::default_delete<CSemaphore>_>::operator=
                ((unique_ptr<CSemaphore,_std::default_delete<CSemaphore>_> *)
                 in_stack_fffffffffffffa68,
                 (unique_ptr<CSemaphore,_std::default_delete<CSemaphore>_> *)
                 in_stack_fffffffffffffa60);
      std::unique_ptr<CSemaphore,_std::default_delete<CSemaphore>_>::~unique_ptr
                ((unique_ptr<CSemaphore,_std::default_delete<CSemaphore>_> *)
                 in_stack_fffffffffffffa68);
    }
    bVar1 = std::operator==((unique_ptr<CSemaphore,_std::default_delete<CSemaphore>_> *)
                            in_stack_fffffffffffffa68,in_stack_fffffffffffffa60);
    if (bVar1) {
      std::make_unique<CSemaphore,int&>((int *)in_stack_fffffffffffffa70);
      std::unique_ptr<CSemaphore,_std::default_delete<CSemaphore>_>::operator=
                ((unique_ptr<CSemaphore,_std::default_delete<CSemaphore>_> *)
                 in_stack_fffffffffffffa68,
                 (unique_ptr<CSemaphore,_std::default_delete<CSemaphore>_> *)
                 in_stack_fffffffffffffa60);
      std::unique_ptr<CSemaphore,_std::default_delete<CSemaphore>_>::~unique_ptr
                ((unique_ptr<CSemaphore,_std::default_delete<CSemaphore>_> *)
                 in_stack_fffffffffffffa68);
    }
    if (*(long *)(in_RDI.fmt + 0x268) == 0) {
      __assert_fail("m_msgproc",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
                    ,0xcf3,"bool CConnman::Start(CScheduler &, const Options &)");
    }
    CThreadInterrupt::reset
              ((CThreadInterrupt *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
    std::atomic<bool>::operator=
              ((atomic<bool> *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58),false);
    flag = MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58))
    ;
    UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_fffffffffffffa98,
               (AnnotatedMixin<std::mutex> *)in_stack_fffffffffffffa90,
               (char *)CONCAT17(in_stack_fffffffffffffa8f,in_stack_fffffffffffffa88),
               (char *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa7c,
               SUB41(in_stack_fffffffffffffa78 >> 0x18,0));
    in_RDI.fmt[0x2a0] = '\0';
    UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
               CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
    local_340 = util::TraceThread;
    std::thread::
    thread<void(*)(std::basic_string_view<char,std::char_traits<char>>,std::function<void()>),char_const(&)[4],CConnman::Start(CScheduler&,CConnman::Options_const&)::__2,void>
              (in_stack_fffffffffffffaa0,
               (_func_void_basic_string_view<char,_std::char_traits<char>_>_function<void_()> **)
               in_stack_fffffffffffffa98,(char (*) [4])in_stack_fffffffffffffa90,
               (type *)CONCAT17(in_stack_fffffffffffffa8f,in_stack_fffffffffffffa88));
    this_00 = &local_338;
    std::thread::operator=((thread *)in_stack_fffffffffffffa68,(thread *)in_stack_fffffffffffffa60);
    std::thread::~thread((thread *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffaaf,
                        CONCAT16(in_stack_fffffffffffffaae,in_stack_fffffffffffffaa8)),
               (char *)in_stack_fffffffffffffaa0,(allocator<char> *)in_stack_fffffffffffffa98);
    uVar2 = ArgsManager::GetBoolArg
                      ((ArgsManager *)in_stack_fffffffffffffa60,
                       (string *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58),
                       SUB81((ulong)in_stack_fffffffffffffa68 >> 0x38,0));
    bVar3 = uVar2 ^ 0xff;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
    std::allocator<char>::~allocator(local_349);
    if ((bVar3 & 1) == 0) {
      local_380 = util::TraceThread;
      std::thread::
      thread<void(*)(std::basic_string_view<char,std::char_traits<char>>,std::function<void()>),char_const(&)[8],CConnman::Start(CScheduler&,CConnman::Options_const&)::__3,void>
                (in_stack_fffffffffffffaa0,
                 (_func_void_basic_string_view<char,_std::char_traits<char>_>_function<void_()> **)
                 in_stack_fffffffffffffa98,(char (*) [8])in_stack_fffffffffffffa90,
                 (type *)CONCAT17(in_stack_fffffffffffffa8f,in_stack_fffffffffffffa88));
      std::thread::operator=
                ((thread *)in_stack_fffffffffffffa68,(thread *)in_stack_fffffffffffffa60);
      std::thread::~thread((thread *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                 (char *)in_stack_fffffffffffffa70);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                 (char *)in_stack_fffffffffffffa70);
      in_stack_fffffffffffffa60 = "DNS seeding disabled\n";
      in_stack_fffffffffffffa58 = 2;
      logging_function_00._M_str = in_stack_fffffffffffffb28;
      logging_function_00._M_len = (size_t)"DNS seeding disabled\n";
      source_file_00._M_len._4_4_ = in_stack_fffffffffffffb14;
      source_file_00._M_len._0_4_ = in_stack_fffffffffffffb10;
      source_file_00._M_str = (char *)in_stack_fffffffffffffb18._M_current;
      LogPrintFormatInternal<>
                (logging_function_00,source_file_00,source_line,(LogFlags)flag,
                 in_stack_fffffffffffffc00,in_RDI);
    }
    local_398 = util::TraceThread;
    std::thread::
    thread<void(*)(std::basic_string_view<char,std::char_traits<char>>,std::function<void()>),char_const(&)[7],CConnman::Start(CScheduler&,CConnman::Options_const&)::__4,void>
              (in_stack_fffffffffffffaa0,
               (_func_void_basic_string_view<char,_std::char_traits<char>_>_function<void_()> **)
               in_stack_fffffffffffffa98,(char (*) [7])in_stack_fffffffffffffa90,
               (type *)CONCAT17(in_stack_fffffffffffffa8f,in_stack_fffffffffffffa88));
    std::thread::operator=((thread *)in_stack_fffffffffffffa68,(thread *)in_stack_fffffffffffffa60);
    std::thread::~thread((thread *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
    if (((*(byte *)(in_RDX + 0xd1) & 1) == 0) ||
       (bVar1 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffa68), bVar1)) {
      if (((*(byte *)(in_RDX + 0xd1) & 1) != 0) ||
         (bVar1 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffffa68), !bVar1)) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(this_00,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)CONCAT17(uVar2,CONCAT16(bVar3,in_stack_fffffffffffffaa8)));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58),
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x21ce10);
        std::thread::
        thread<void(*)(std::basic_string_view<char,std::char_traits<char>>,std::function<void()>),char_const(&)[8],CConnman::Start(CScheduler&,CConnman::Options_const&)::__5,void>
                  (in_stack_fffffffffffffaa0,
                   (_func_void_basic_string_view<char,_std::char_traits<char>_>_function<void_()> **
                   )in_stack_fffffffffffffa98,(char (*) [8])in_stack_fffffffffffffa90,
                   (type *)CONCAT17(in_stack_fffffffffffffa8f,in_stack_fffffffffffffa88));
        std::thread::operator=
                  ((thread *)in_stack_fffffffffffffa68,(thread *)in_stack_fffffffffffffa60);
        std::thread::~thread
                  ((thread *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
        Start(CScheduler&,CConnman::Options_const&)::$_5::~__5
                  ((type *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
      }
      std::thread::
      thread<void(*)(std::basic_string_view<char,std::char_traits<char>>,std::function<void()>),char_const(&)[8],CConnman::Start(CScheduler&,CConnman::Options_const&)::__6,void>
                (in_stack_fffffffffffffaa0,
                 (_func_void_basic_string_view<char,_std::char_traits<char>_>_function<void_()> **)
                 in_stack_fffffffffffffa98,(char (*) [8])in_stack_fffffffffffffa90,
                 (type *)CONCAT17(in_stack_fffffffffffffa8f,in_stack_fffffffffffffa88));
      std::thread::operator=
                ((thread *)in_stack_fffffffffffffa68,(thread *)in_stack_fffffffffffffa60);
      std::thread::~thread((thread *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
      bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> *)
                         CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
      if (bVar1) {
        std::thread::
        thread<void(*)(std::basic_string_view<char,std::char_traits<char>>,std::function<void()>),char_const(&)[10],CConnman::Start(CScheduler&,CConnman::Options_const&)::__7,void>
                  (in_stack_fffffffffffffaa0,
                   (_func_void_basic_string_view<char,_std::char_traits<char>_>_function<void_()> **
                   )in_stack_fffffffffffffa98,(char (*) [10])in_stack_fffffffffffffa90,
                   (type *)CONCAT17(in_stack_fffffffffffffa8f,in_stack_fffffffffffffa88));
        std::thread::operator=
                  ((thread *)in_stack_fffffffffffffa68,(thread *)in_stack_fffffffffffffa60);
        std::thread::~thread
                  ((thread *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
      }
      std::function<void()>::
      function<CConnman::Start(CScheduler&,CConnman::Options_const&)::__0,void>
                ((function<void_()> *)in_stack_fffffffffffffa68,
                 (anon_class_8_1_8991fb9c *)in_stack_fffffffffffffa60);
      std::chrono::duration<long,std::ratio<1l,1000l>>::duration<long,std::ratio<60l,1l>,void>
                ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffffa60,
                 (duration<long,_std::ratio<60L,_1L>_> *)
                 CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
      CScheduler::scheduleEvery
                ((CScheduler *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                 (Function *)in_stack_fffffffffffffa70,in_stack_fffffffffffffad8);
      std::function<void_()>::~function
                ((function<void_()> *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58))
      ;
      bVar1 = NetGroupManager::UsingASMap
                        ((NetGroupManager *)
                         CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
      if (bVar1) {
        ASMapHealthCheck((CConnman *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
        std::function<void()>::
        function<CConnman::Start(CScheduler&,CConnman::Options_const&)::__1,void>
                  ((function<void_()> *)in_stack_fffffffffffffa68,
                   (anon_class_8_1_8991fb9c *)in_stack_fffffffffffffa60);
        std::chrono::duration<long,std::ratio<1l,1000l>>::duration<long,std::ratio<3600l,1l>,void>
                  ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffffa60,
                   (duration<long,_std::ratio<3600L,_1L>_> *)
                   CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
        CScheduler::scheduleEvery
                  ((CScheduler *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                   (Function *)in_stack_fffffffffffffa70,in_stack_fffffffffffffad8);
        std::function<void_()>::~function
                  ((function<void_()> *)
                   CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
      }
      local_481 = true;
    }
    else {
      if (*(long *)(in_RDI.fmt + 0x260) != 0) {
        __s = *(char **)(in_RDI.fmt + 0x260);
        str_01.lit._6_1_ = bVar3;
        str_01.lit._0_6_ = in_stack_fffffffffffffaa8;
        str_01.lit._7_1_ = uVar2;
        ::_(str_01);
        __a = local_3a1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar2,CONCAT16(bVar3,in_stack_fffffffffffffaa8)),__s,__a);
        CClientUIInterface::ThreadSafeMessageBox
                  ((CClientUIInterface *)in_stack_fffffffffffffa70,
                   (bilingual_str *)in_stack_fffffffffffffa68,(string *)in_stack_fffffffffffffa60,
                   in_stack_fffffffffffffa5c);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
        std::allocator<char>::~allocator(local_3a1);
        bilingual_str::~bilingual_str
                  ((bilingual_str *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
      }
      local_481 = false;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffa68);
    Proxy::~Proxy((Proxy *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
  }
  else {
    if (*(long *)(in_RDI.fmt + 0x260) != 0) {
      str.lit._6_1_ = in_stack_fffffffffffffaae;
      str.lit._0_6_ = in_stack_fffffffffffffaa8;
      str.lit._7_1_ = in_stack_fffffffffffffaaf;
      ::_(str);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffaaf,
                          CONCAT16(in_stack_fffffffffffffaae,in_stack_fffffffffffffaa8)),
                 (char *)in_stack_fffffffffffffaa0,(allocator<char> *)in_stack_fffffffffffffa98);
      CClientUIInterface::ThreadSafeMessageBox
                ((CClientUIInterface *)in_stack_fffffffffffffa70,
                 (bilingual_str *)in_stack_fffffffffffffa68,(string *)in_stack_fffffffffffffa60,
                 in_stack_fffffffffffffa5c);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
      std::allocator<char>::~allocator(local_2b1);
      bilingual_str::~bilingual_str
                ((bilingual_str *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
    }
    local_481 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_481;
}

Assistant:

bool CConnman::Start(CScheduler& scheduler, const Options& connOptions)
{
    AssertLockNotHeld(m_total_bytes_sent_mutex);
    Init(connOptions);

    if (fListen && !InitBinds(connOptions)) {
        if (m_client_interface) {
            m_client_interface->ThreadSafeMessageBox(
                _("Failed to listen on any port. Use -listen=0 if you want this."),
                "", CClientUIInterface::MSG_ERROR);
        }
        return false;
    }

    Proxy i2p_sam;
    if (GetProxy(NET_I2P, i2p_sam) && connOptions.m_i2p_accept_incoming) {
        m_i2p_sam_session = std::make_unique<i2p::sam::Session>(gArgs.GetDataDirNet() / "i2p_private_key",
                                                                i2p_sam, &interruptNet);
    }

    // Randomize the order in which we may query seednode to potentially prevent connecting to the same one every restart (and signal that we have restarted)
    std::vector<std::string> seed_nodes = connOptions.vSeedNodes;
    if (!seed_nodes.empty()) {
        std::shuffle(seed_nodes.begin(), seed_nodes.end(), FastRandomContext{});
    }

    if (m_use_addrman_outgoing) {
        // Load addresses from anchors.dat
        m_anchors = ReadAnchors(gArgs.GetDataDirNet() / ANCHORS_DATABASE_FILENAME);
        if (m_anchors.size() > MAX_BLOCK_RELAY_ONLY_ANCHORS) {
            m_anchors.resize(MAX_BLOCK_RELAY_ONLY_ANCHORS);
        }
        LogPrintf("%i block-relay-only anchors will be tried for connections.\n", m_anchors.size());
    }

    if (m_client_interface) {
        m_client_interface->InitMessage(_("Starting network threads…").translated);
    }

    fAddressesInitialized = true;

    if (semOutbound == nullptr) {
        // initialize semaphore
        semOutbound = std::make_unique<CSemaphore>(std::min(m_max_automatic_outbound, m_max_automatic_connections));
    }
    if (semAddnode == nullptr) {
        // initialize semaphore
        semAddnode = std::make_unique<CSemaphore>(m_max_addnode);
    }

    //
    // Start threads
    //
    assert(m_msgproc);
    interruptNet.reset();
    flagInterruptMsgProc = false;

    {
        LOCK(mutexMsgProc);
        fMsgProcWake = false;
    }

    // Send and receive from sockets, accept connections
    threadSocketHandler = std::thread(&util::TraceThread, "net", [this] { ThreadSocketHandler(); });

    if (!gArgs.GetBoolArg("-dnsseed", DEFAULT_DNSSEED))
        LogPrintf("DNS seeding disabled\n");
    else
        threadDNSAddressSeed = std::thread(&util::TraceThread, "dnsseed", [this] { ThreadDNSAddressSeed(); });

    // Initiate manual connections
    threadOpenAddedConnections = std::thread(&util::TraceThread, "addcon", [this] { ThreadOpenAddedConnections(); });

    if (connOptions.m_use_addrman_outgoing && !connOptions.m_specified_outgoing.empty()) {
        if (m_client_interface) {
            m_client_interface->ThreadSafeMessageBox(
                _("Cannot provide specific connections and have addrman find outgoing connections at the same time."),
                "", CClientUIInterface::MSG_ERROR);
        }
        return false;
    }
    if (connOptions.m_use_addrman_outgoing || !connOptions.m_specified_outgoing.empty()) {
        threadOpenConnections = std::thread(
            &util::TraceThread, "opencon",
            [this, connect = connOptions.m_specified_outgoing, seed_nodes = std::move(seed_nodes)] { ThreadOpenConnections(connect, seed_nodes); });
    }

    // Process messages
    threadMessageHandler = std::thread(&util::TraceThread, "msghand", [this] { ThreadMessageHandler(); });

    if (m_i2p_sam_session) {
        threadI2PAcceptIncoming =
            std::thread(&util::TraceThread, "i2paccept", [this] { ThreadI2PAcceptIncoming(); });
    }

    // Dump network addresses
    scheduler.scheduleEvery([this] { DumpAddresses(); }, DUMP_PEERS_INTERVAL);

    // Run the ASMap Health check once and then schedule it to run every 24h.
    if (m_netgroupman.UsingASMap()) {
        ASMapHealthCheck();
        scheduler.scheduleEvery([this] { ASMapHealthCheck(); }, ASMAP_HEALTH_CHECK_INTERVAL);
    }

    return true;
}